

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

uint8_t * find_bytes(uint8_t *buffer,size_t bufferSize,uint8_t *pattern,size_t patternSize)

{
  int iVar1;
  uint8_t *__s1;
  size_t local_40;
  size_t buffer_left;
  uchar *p;
  size_t patternSize_local;
  uint8_t *pattern_local;
  size_t bufferSize_local;
  uint8_t *buffer_local;
  
  buffer_left = (size_t)buffer;
  for (local_40 = bufferSize;
      (__s1 = (uint8_t *)memchr((void *)buffer_left,(uint)*pattern,local_40), __s1 != (uint8_t *)0x0
      && (patternSize <= local_40)); local_40 = local_40 - 1) {
    iVar1 = memcmp(__s1,pattern,patternSize);
    if (iVar1 == 0) {
      return __s1;
    }
    buffer_left = (size_t)(__s1 + 1);
  }
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t* find_bytes(
    const uint8_t* buffer, size_t bufferSize, 
    const uint8_t* pattern, size_t patternSize)
{
  const unsigned char *p = buffer;
  size_t buffer_left = bufferSize;
  while ((p = memchr(p, pattern[0], buffer_left)) != NULL)
  {
    if (patternSize > buffer_left)
      break;

    if (memcmp(p, pattern, patternSize) == 0)
      return (uint8_t*)p;

    ++p;
    --buffer_left;
  }

  return NULL;
}